

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls2Test::iterate
          (MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls2Test *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  long lVar4;
  TestError *this_01;
  bool bVar5;
  GLint gl_max_integer_samples_value;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  initInternals(this);
  (**(code **)(lVar3 + 0x868))(0x9110);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"Could not retrieve GL_MAX_INTEGER_SAMPLES value.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x7a9);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar5 = bVar1;
    (**(code **)(lVar3 + 0x1240))(0x8d41,1,(&DAT_01b1dd10)[lVar4],1,1);
    iVar2 = (**(code **)(lVar3 + 0x800))();
    if (iVar2 != 0x502) {
      local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"glRenderbufferStorageMultisample() generated error code ",0x38)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," when GL_INVALID_OPERATION was expected.",0x28);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_130);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Invalid error code generated by glRenderbufferStorageMultisample() call.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                 ,0x7bf);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar4 = 1;
    bVar1 = false;
  } while (bVar5);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls2Test::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Retrieve GL_MAX_INTEGER_SAMPLES pname value */
	glw::GLint gl_max_integer_samples_value = 0;

	gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &gl_max_integer_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve GL_MAX_INTEGER_SAMPLES value.");

	/* Iterate through a set of valid integer internalformats */
	const glw::GLenum  integer_internalformats[] = { GL_RG8UI, GL_RGBA32I };
	const unsigned int n_integer_internalformats = sizeof(integer_internalformats) / sizeof(integer_internalformats[0]);

	for (unsigned int n_internalformat = 0; n_internalformat < n_integer_internalformats; ++n_internalformat)
	{
		glw::GLenum		  error_code	 = GL_NO_ERROR;
		const glw::GLenum internalformat = integer_internalformats[n_internalformat];

		/* Execute the test */
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, gl_max_integer_samples_value + 1, internalformat,
										  1,  /* width */
										  1); /* height */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glRenderbufferStorageMultisample() generated error code "
							   << error_code << " when GL_INVALID_OPERATION was expected." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid error code generated by glRenderbufferStorageMultisample() call.");
		}
	} /* for (all internalformats) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}